

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::BooleanDatatypeValidator::BooleanDatatypeValidator
          (BooleanDatatypeValidator *this,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,
          RefArrayVectorOf<char16_t> *enums,int finalSet,MemoryManager *manager)

{
  int *piVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  XMLCh *__src;
  XMLSize_t XVar5;
  RefHashTableBucketElem<xercesc_4_0::KVStringPair> *pRVar6;
  int iVar7;
  KVStringPair *toCopy;
  XMLCh *pXVar8;
  undefined4 extraout_var;
  RegularExpression *pRVar9;
  InvalidDatatypeFacetException *pIVar10;
  XMLCh *pXVar11;
  XMLSize_t XVar12;
  MemoryManager *manager_00;
  size_t __n;
  KVStringPair pair;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> local_98;
  MemoryManager *local_68;
  KVStringPair local_60;
  
  DatatypeValidator::DatatypeValidator
            (&this->super_DatatypeValidator,baseValidator,facets,finalSet,Boolean,manager);
  (this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__DatatypeValidator_0040c6c8;
  if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    if (enums != (RefArrayVectorOf<char16_t> *)0x0) {
      (*(enums->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])(enums);
      pIVar10 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                 ,0x36,FACET_Invalid_Tag,"enumeration",(char *)0x0,(char *)0x0,(char *)0x0,manager);
      __cxa_throw(pIVar10,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
    }
    local_98.super_XMLEnumerator<xercesc_4_0::KVStringPair>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHashTableOfEnumerator_00406778;
    local_98.fAdopted = false;
    local_98.fCurElem = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
    local_98.fCurHash = 0;
    pRVar6 = local_98.fCurElem;
    if (facets->fHashModulus != 0) {
      XVar5 = 1;
      do {
        XVar12 = XVar5;
        pRVar6 = facets->fBucketList[XVar12 - 1];
        if (facets->fBucketList[XVar12 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) break;
        XVar5 = XVar12 + 1;
        pRVar6 = local_98.fCurElem;
        local_98.fCurHash = XVar12;
      } while (XVar12 != facets->fHashModulus);
    }
    local_98.fCurElem = pRVar6;
    local_98.fToEnum = facets;
    local_98.fMemoryManager = manager;
    local_68 = manager;
    while ((local_98.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (local_98.fCurHash != (local_98.fToEnum)->fHashModulus))) {
      toCopy = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement(&local_98);
      KVStringPair::KVStringPair(&local_60,toCopy);
      __src = local_60.fValue;
      if (local_60.fKey != L"pattern") {
        pXVar8 = L"pattern";
        if (local_60.fKey != (XMLCh *)0x0) {
          pXVar8 = L"pattern";
          pXVar11 = local_60.fKey;
          while (XVar3 = *pXVar11, XVar3 != L'\0') {
            pXVar11 = pXVar11 + 1;
            XVar4 = *pXVar8;
            pXVar8 = pXVar8 + 1;
            if (XVar3 != XVar4) goto LAB_002f1d36;
          }
        }
        if (*pXVar8 != L'\0') {
LAB_002f1d36:
          pIVar10 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar10,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                     ,0x4d,FACET_Invalid_Tag,local_60.fKey,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     local_68);
          __cxa_throw(pIVar10,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
        }
      }
      if ((this->super_DatatypeValidator).fPattern != (XMLCh *)0x0) {
        (*((this->super_DatatypeValidator).fMemoryManager)->_vptr_MemoryManager[4])();
        pRVar9 = (this->super_DatatypeValidator).fRegex;
        if (pRVar9 != (RegularExpression *)0x0) {
          (*pRVar9->_vptr_RegularExpression[1])();
        }
      }
      manager_00 = (this->super_DatatypeValidator).fMemoryManager;
      if (__src == (XMLCh *)0x0) {
        pXVar8 = (XMLCh *)0x0;
      }
      else {
        __n = 0;
        do {
          psVar2 = (short *)((long)__src + __n);
          __n = __n + 2;
        } while (*psVar2 != 0);
        iVar7 = (*manager_00->_vptr_MemoryManager[3])(manager_00,__n);
        pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar7);
        memcpy(pXVar8,__src,__n);
        manager_00 = (this->super_DatatypeValidator).fMemoryManager;
      }
      (this->super_DatatypeValidator).fPattern = pXVar8;
      pRVar9 = (RegularExpression *)XMemory::operator_new(0x70,manager_00);
      RegularExpression::RegularExpression
                (pRVar9,(this->super_DatatypeValidator).fPattern,L"X",
                 (this->super_DatatypeValidator).fMemoryManager);
      (this->super_DatatypeValidator).fRegex = pRVar9;
      piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
      *(byte *)piVar1 = (byte)*piVar1 | 8;
      KVStringPair::~KVStringPair(&local_60);
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_98);
  }
  return;
}

Assistant:

BooleanDatatypeValidator::BooleanDatatypeValidator(
                          DatatypeValidator*            const baseValidator
                        , RefHashTableOf<KVStringPair>* const facets
                        , RefArrayVectorOf<XMLCh>*      const enums
                        , const int                           finalSet
                        , MemoryManager* const                manager)
:DatatypeValidator(baseValidator, facets, finalSet, DatatypeValidator::Boolean, manager)
{

    // Set Facets if any defined
    if ( facets )
    {

        // Boolean shall NOT have enumeration
        if (enums) {
            delete enums;
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                    , XMLExcepts::FACET_Invalid_Tag
                    , "enumeration"
                    , manager);
        }

        XMLCh* key;
        XMLCh* value;
        RefHashTableOfEnumerator<KVStringPair> e(facets, false, manager);

        while (e.hasMoreElements())
        {
            KVStringPair pair = e.nextElement();
            key = pair.getKey();
            value = pair.getValue();

            if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN))
            {
                setPattern(value);
                setFacetsDefined(DatatypeValidator::FACET_PATTERN);
            }
            else
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                        , XMLExcepts::FACET_Invalid_Tag
                        , key
                        , manager);
            }

        }

    }// End of facet setting
}